

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad-otp.c
# Opt level: O0

void pad_otp(uint32_t code,uint length,char *buf)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char tmp;
  char *pcStack_28;
  int digit;
  char *pbuf;
  uint len;
  uint i;
  char *buf_local;
  uint length_local;
  uint32_t code_local;
  
  pcStack_28 = buf;
  buf_local._4_4_ = code;
  do {
    pcVar3 = pcStack_28 + 1;
    *pcStack_28 = (char)(buf_local._4_4_ % 10) + '0';
    buf_local._4_4_ = buf_local._4_4_ / 10;
    pcStack_28 = pcVar3;
  } while (buf_local._4_4_ != 0);
  for (pbuf._4_4_ = (int)pcVar3 - (int)buf; pbuf._4_4_ < length; pbuf._4_4_ = pbuf._4_4_ + 1) {
    *pcStack_28 = '0';
    pcStack_28 = pcStack_28 + 1;
  }
  *pcStack_28 = '\0';
  uVar2 = (int)pcStack_28 - (int)buf;
  for (pbuf._4_4_ = 0; pbuf._4_4_ < uVar2 >> 1; pbuf._4_4_ = pbuf._4_4_ + 1) {
    cVar1 = buf[pbuf._4_4_];
    buf[pbuf._4_4_] = buf[(uVar2 - pbuf._4_4_) - 1];
    buf[(uVar2 - pbuf._4_4_) - 1] = cVar1;
  }
  return;
}

Assistant:

void pad_otp(uint32_t code, unsigned length, char *buf) {
  unsigned i;
  unsigned len;
  char *pbuf = buf;

  do {
    int digit = code % 10;
    *(pbuf++) = '0' + digit;
    code /= 10;
  } while (code > 0);

  for (i = (pbuf - buf); i < length; i++) {
    *(pbuf++) = '0';
  }

  *pbuf = '\0';

  len = pbuf - buf;

  for (i = 0; i < len / 2; i++) {
    char tmp = buf[i];
    buf[i] = buf[len - i - 1];
    buf[len - i - 1] = tmp;
  }
}